

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O2

void cut_and_splice(TreeNode *n1,TreeNode *n2,int new_x,int new_y,int *x1,int *y1,int *x2,int *y2,
                   TreeNode *e,int n2ton1)

{
  uint uVar1;
  int iVar2;
  dl_el *pdVar3;
  TreeNode *pTVar4;
  dl_el_s *pdVar5;
  dl_t paVar6;
  TreeNode *pTVar7;
  TreeNode *pTVar8;
  TreeNode_s *pTVar9;
  TreeNode *pTVar10;
  int iVar11;
  
  pTVar9 = n1->parent;
  remove_child(pTVar9->children,n1);
  pTVar4 = (TreeNode *)malloc(0x38);
  pTVar4->x = new_x;
  pTVar4->y = new_y;
  pTVar4->mark = curr_mark;
  pTVar4->parent = pTVar9;
  pdVar5 = (dl_el_s *)malloc(0x18);
  if (pdVar5 == (dl_el_s *)0x0) {
    puts("Out of memory!!");
  }
  else {
    pdVar5[1].prev = (dl_el_s *)pTVar4;
    pdVar5->next = (dl_el_s *)0x0;
    paVar6 = pTVar9->children;
    uVar1 = paVar6->count;
    if (uVar1 == 0) {
      pdVar5->prev = (dl_el_s *)0x0;
      paVar6->last = pdVar5;
      paVar6->first = pdVar5;
      paVar6->count = 1;
    }
    else {
      pdVar3 = paVar6->last;
      pdVar5->prev = pdVar3;
      pdVar3->next = pdVar5;
      paVar6->last = pdVar5;
      paVar6->count = uVar1 + 1;
    }
  }
  n1->parent = pTVar4;
  paVar6 = dl_alloc();
  pTVar4->children = paVar6;
  pdVar5 = (dl_el_s *)malloc(0x18);
  if (pdVar5 == (dl_el_s *)0x0) {
    puts("Out of memory!!");
  }
  else {
    pdVar5[1].prev = (dl_el_s *)n1;
    pdVar5->next = (dl_el_s *)0x0;
    uVar1 = paVar6->count;
    if (uVar1 == 0) {
      pdVar5->prev = (dl_el_s *)0x0;
      paVar6->last = pdVar5;
      paVar6->first = pdVar5;
      paVar6->count = 1;
    }
    else {
      pdVar3 = paVar6->last;
      pdVar5->prev = pdVar3;
      pdVar3->next = pdVar5;
      paVar6->last = pdVar5;
      paVar6->count = uVar1 + 1;
    }
  }
  pTVar4->order = -1;
  pTVar4->e = n1->e;
  pTVar4->id = n1->id;
  if (*x1 != n1->x) {
    x2 = x1;
  }
  *x2 = new_x;
  if (*y1 != n1->y) {
    y2 = y1;
  }
  *y2 = new_y;
  pTVar10 = n2;
  if (-1 < n2->order) {
    pTVar10 = n2->parent;
    iVar2 = n2->x;
    if (pTVar10->x == iVar2) {
      iVar11 = n2->y;
      if (pTVar10->y == iVar11) goto LAB_001275d3;
    }
    else {
      iVar11 = n2->y;
    }
    pTVar7 = (TreeNode *)malloc(0x38);
    pTVar7->mark = curr_mark;
    pTVar7->order = -1;
    pTVar7->id = n2->id;
    pTVar7->x = iVar2;
    pTVar7->y = iVar11;
    pTVar8 = n2->e;
    if (n2->e == n2) {
      pTVar8 = pTVar7;
    }
    pTVar7->e = pTVar8;
    if (e == n2) {
      e = pTVar7;
    }
    pTVar7->len = n2->len;
    pTVar7->blen = n2->blen;
    n2->blen = 0;
    remove_child(pTVar10->children,n2);
    pdVar5 = (dl_el_s *)malloc(0x18);
    if (pdVar5 == (dl_el_s *)0x0) {
      puts("Out of memory!!");
      pTVar9 = n2->parent;
    }
    else {
      pdVar5[1].prev = (dl_el_s *)pTVar7;
      pdVar5->next = (dl_el_s *)0x0;
      pTVar9 = n2->parent;
      paVar6 = pTVar9->children;
      uVar1 = paVar6->count;
      if (uVar1 == 0) {
        pdVar5->prev = (dl_el_s *)0x0;
        paVar6->last = pdVar5;
        paVar6->first = pdVar5;
        paVar6->count = 1;
      }
      else {
        pdVar3 = paVar6->last;
        pdVar5->prev = pdVar3;
        pdVar3->next = pdVar5;
        paVar6->last = pdVar5;
        paVar6->count = uVar1 + 1;
      }
    }
    pTVar7->parent = pTVar9;
    n2->parent = pTVar7;
    paVar6 = dl_alloc();
    pTVar7->children = paVar6;
    pdVar5 = (dl_el_s *)malloc(0x18);
    pTVar10 = pTVar7;
    if (pdVar5 == (dl_el_s *)0x0) {
      puts("Out of memory!!");
    }
    else {
      pdVar5[1].prev = (dl_el_s *)n2;
      pdVar5->next = (dl_el_s *)0x0;
      uVar1 = paVar6->count;
      if (uVar1 == 0) {
        pdVar5->prev = (dl_el_s *)0x0;
        paVar6->last = pdVar5;
        paVar6->first = pdVar5;
        paVar6->count = 1;
      }
      else {
        pdVar3 = paVar6->last;
        pdVar5->prev = pdVar3;
        pdVar3->next = pdVar5;
        paVar6->last = pdVar5;
        paVar6->count = uVar1 + 1;
      }
    }
  }
LAB_001275d3:
  pTVar8 = pTVar4;
  if (n2ton1 != 0) {
    pTVar8 = pTVar10;
    pTVar10 = pTVar4;
  }
  splice2(pTVar10,pTVar8,e);
  return;
}

Assistant:

void cut_and_splice(TreeNode *n1, TreeNode *n2,
		    DTYPE new_x, DTYPE new_y,
		    DTYPE *x1, DTYPE *y1, DTYPE *x2, DTYPE *y2,
		    TreeNode *e, int n2ton1)
{
  TreeNode *p1, *node, *s;
  
  /* new steiner node */
  p1 = n1->parent;
  remove_child(p1->children, n1);
  node = (TreeNode*)malloc(sizeof(TreeNode));
  node->x = new_x;
  node->y = new_y;
  node->mark = curr_mark;

  node->parent = p1;
  dl_append(TreeNode*, p1->children, node);
  n1->parent = node;
  node->children = dl_alloc();
  dl_append(TreeNode*, node->children, n1);
  node->order = -1;

  node->e = n1->e;
  node->id = n1->id;

  if (*x1==n1->x) {
    *x2 = new_x;
  } else {
    *x1 = new_x;
  }
  if (*y1==n1->y) {
    *y2 = new_y;
  } else {
    *y1 = new_y;
  }

  if (n2->order >= 0) {
    /* n2 is a pin, need to replicate a steiner node */
    s = n2->parent;
    if (s->x!=n2->x || s->y!=n2->y) {
      s = (TreeNode*)malloc(sizeof(TreeNode));
      s->mark = curr_mark;
      s->order = -1;
      s->id = n2->id;
      s->x = n2->x;
      s->y = n2->y;
      s->e = n2->e;
      if (s->e == n2) {
	s->e = s;
      }
      if (e == n2) {
	e = s;
      }
      s->len = n2->len;
      s->blen = n2->blen;
      n2->blen = 0;

      remove_child(n2->parent->children, n2);
      dl_append(TreeNode*, n2->parent->children, s);
      s->parent = n2->parent;
      n2->parent = s;
      s->children = dl_alloc();
      dl_append(TreeNode*, s->children, n2);
    }
    n2 = s;
  }

  if (n2ton1) {
    splice2(node, n2, e);
  } else {
    splice2(n2, node, e);
  }
}